

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionController_AddPegoutTxOut_Test::TestBody
          (ConfidentialTransactionController_AddPegoutTxOut_Test *this)

{
  char *pcVar1;
  Amount AVar2;
  allocator local_94f;
  allocator local_94e;
  allocator local_94d;
  allocator local_94c;
  allocator local_94b;
  allocator local_94a;
  allocator local_949;
  AssertionResult gtest_ar;
  undefined1 local_920 [32];
  string local_900;
  string local_8e0;
  undefined1 local_8c0 [32];
  Amount local_8a0;
  string local_890;
  string local_870;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_850;
  string local_838;
  Privkey local_818;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_7f8;
  ConfidentialTransactionController txc;
  string local_790;
  Address local_770;
  Address addr;
  ConfidentialTxOutReference local_470;
  ConfidentialTxOutReference local_378;
  ConfidentialTxOutReference local_280;
  ConfidentialTxInReference local_188;
  
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&txc,2,0);
  cfd::core::Address::Address(&addr);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)local_920);
  cfd::core::Txid::Txid((Txid *)&local_770,(string *)&gtest_ar);
  cfd::ConfidentialTransactionController::AddTxIn(&local_188,&txc,(Txid *)&local_770,0,0xfffffffd);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_188);
  cfd::core::Txid::~Txid((Txid *)&local_770);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)local_920,"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA",(allocator *)&local_890);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address
            (&local_770,(string *)local_920,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &local_8e0);
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_8c0._0_8_ = AVar2.amount_;
  local_8c0[8] = AVar2.ignore_check_;
  std::__cxx11::string::string
            ((string *)&local_900,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,(allocator *)&local_818);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar,&local_900);
  cfd::ConfidentialTransactionController::AddTxOut
            (&local_280,&txc,&local_770,(Amount *)local_8c0,(ConfidentialAssetId *)&gtest_ar);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_280);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_900);
  cfd::core::Address::~Address(&local_770);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &local_8e0);
  std::__cxx11::string::~string((string *)local_920);
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_8a0.amount_ = AVar2.amount_;
  local_8a0.ignore_check_ = AVar2.ignore_check_;
  std::__cxx11::string::string
            ((string *)local_920,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             &local_949);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)local_920);
  std::__cxx11::string::string
            ((string *)&local_8e0,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"
             ,&local_94a);
  cfd::core::BlockHash::BlockHash((BlockHash *)&local_900,&local_8e0);
  std::__cxx11::string::string((string *)local_8c0,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",&local_94b)
  ;
  cfd::core::Address::Address(&local_770,(string *)local_8c0);
  std::__cxx11::string::string
            ((string *)&local_890,
             "0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d",&local_94c);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_7f8,&local_890);
  std::__cxx11::string::string
            ((string *)&local_838,"cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL",&local_94d)
  ;
  cfd::core::Privkey::FromWif(&local_818,&local_838,kRegtest,true);
  std::__cxx11::string::string
            ((string *)&local_790,
             "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))"
             ,&local_94e);
  std::__cxx11::string::string
            ((string *)&local_870,
             "030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"
             ,&local_94f);
  cfd::core::ByteData::ByteData((ByteData *)&local_850,&local_870);
  cfd::ConfidentialTransactionController::AddPegoutTxOut
            (&local_378,&txc,&local_8a0,(ConfidentialAssetId *)&gtest_ar,(BlockHash *)&local_900,
             &local_770,kRegtest,(Pubkey *)&local_7f8,&local_818,&local_790,0,(ByteData *)&local_850
             ,kElementsRegtest,&addr);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_378);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_850);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::~string((string *)&local_790);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_818);
  std::__cxx11::string::~string((string *)&local_838);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_7f8);
  std::__cxx11::string::~string((string *)&local_890);
  cfd::core::Address::~Address(&local_770);
  std::__cxx11::string::~string((string *)local_8c0);
  cfd::core::BlockHash::~BlockHash((BlockHash *)&local_900);
  std::__cxx11::string::~string((string *)&local_8e0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_920);
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_920._0_8_ = AVar2.amount_;
  local_920[8] = AVar2.ignore_check_;
  std::__cxx11::string::string
            ((string *)&gtest_ar,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)&local_900);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&local_770,(string *)&gtest_ar);
  cfd::ConfidentialTransactionController::AddTxOutFee
            (&local_470,&txc,(Amount *)local_920,(ConfidentialAssetId *)&local_770);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_470);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&local_770);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)&local_770,&txc.super_AbstractTransactionController);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txc.GetHex().c_str()",
             "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
             ,(char *)local_770._0_8_,
             "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
            );
  std::__cxx11::string::~string((string *)&local_770);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_770);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_920,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xe3,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_920,(Message *)&local_770);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_920);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_770);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_770,&addr);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"addr.GetAddress().c_str()",
             "\"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo\"",(char *)local_770._0_8_,
             "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");
  std::__cxx11::string::~string((string *)&local_770);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_770);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_920,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xe4,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_920,(Message *)&local_770);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_920);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_770);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Address::~Address(&addr);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&txc);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, AddPegoutTxOut)
{
    ConfidentialTransactionController txc(2, 0);
    Address addr;
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"),
        NetType::kRegtest,
        Pubkey("0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        Privkey::FromWif("cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL", NetType::kRegtest),
        "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))",
        0,
        ByteData("030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        NetType::kElementsRegtest,
        &addr);
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");
    EXPECT_STREQ(addr.GetAddress().c_str(), "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");
}